

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O3

void __thiscall
imrt::Collimator::Collimator
          (Collimator *this,string *coord_filename,
          set<int,_std::less<int>,_std::allocator<int>_> *angles)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  long *plVar7;
  _Base_ptr p_Var8;
  string line;
  string aux;
  ifstream coord_file;
  undefined1 auStack_2b8 [8];
  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
  *local_2b0;
  set<int,_std::less<int>,_std::allocator<int>_> *local_2a8;
  char *local_2a0;
  long local_298;
  char local_290 [16];
  undefined1 local_280 [8];
  _Alloc_hider local_278;
  undefined1 local_270 [8];
  char local_268 [16];
  char *local_258;
  undefined8 local_250;
  char local_248 [16];
  long local_238 [4];
  byte abStack_218 [488];
  
  p_Var1 = &(this->beam_coord)._M_t._M_impl.super__Rb_tree_header;
  (this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->angle_coord)._M_t._M_impl.super__Rb_tree_header;
  (this->angle_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->angle_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->angle_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->angle_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header;
  (this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->angle_coord)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header;
  (this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->angles).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)&this->angles;
  (this->angles).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)&this->angles;
  (this->angles).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  local_2b0 = (vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
               *)&this->coord_files;
  (this->coord_files).
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->coord_files).
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->coord_files).
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->reference)._M_t._M_impl.super__Rb_tree_header;
  (this->reference)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->reference)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->reference)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->reference)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header;
  (this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->reference)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2a8 = angles;
  std::ifstream::ifstream(local_238,(coord_filename->_M_dataplus)._M_p,_S_in);
  local_2a0 = local_290;
  local_298 = 0;
  local_290[0] = '\0';
  local_258 = local_248;
  local_250 = 0;
  local_248[0] = '\0';
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERROR: unable to open instance file: ",0x25);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(coord_filename->_M_dataplus)._M_p,
                        coord_filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", stopping! \n",0xd);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"##Reading collimator coordinates info.",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  lVar2 = *(long *)(local_238[0] + -0x18);
  if ((abStack_218[lVar2] & 5) == 0) {
    p_Var1 = &(local_2a8->_M_t)._M_impl.super__Rb_tree_header;
    do {
      cVar3 = std::ios::widen((char)auStack_2b8 + (char)lVar2 + -0x80);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_2a0,cVar3);
      if (local_298 != 0) {
        std::__cxx11::string::find((char *)&local_2a0,delimiter_abi_cxx11_,0);
        std::__cxx11::string::substr((ulong)local_280,(ulong)&local_2a0);
        std::__cxx11::string::operator=((string *)&local_258,(string *)local_280);
        if ((undefined1 *)CONCAT44(local_280._4_4_,local_280._0_4_) != local_270) {
          operator_delete((undefined1 *)CONCAT44(local_280._4_4_,local_280._0_4_));
        }
        iVar4 = atoi(local_258);
        p_Var6 = (local_2a8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var8 = &p_Var1->_M_header;
        if (p_Var6 != (_Base_ptr)0x0) {
          do {
            if (iVar4 <= (int)p_Var6[1]._M_color) {
              p_Var8 = p_Var6;
            }
            p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < iVar4];
          } while (p_Var6 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var8 != p_Var1) && ((int)p_Var8[1]._M_color <= iVar4)) {
            std::__cxx11::string::find((char *)&local_2a0,delimiter_abi_cxx11_,0);
            std::__cxx11::string::erase((ulong)&local_2a0,0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##  ",4);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_2a0,local_298);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," a:",3);
            plVar7 = (long *)std::ostream::operator<<((ostream *)poVar5,iVar4);
            std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
            std::ostream::put((char)plVar7);
            std::ostream::flush();
            local_278._M_p = local_268;
            local_280._0_4_ = iVar4;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_278,local_2a0,local_2a0 + local_298);
            std::
            vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
            ::emplace_back<std::pair<int,std::__cxx11::string>>
                      (local_2b0,
                       (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_280);
            if (local_278._M_p != local_268) {
              operator_delete(local_278._M_p);
            }
          }
        }
      }
      lVar2 = *(long *)(local_238[0] + -0x18);
    } while ((abStack_218[lVar2] & 5) == 0);
  }
  std::ifstream::close();
  this->n_angles =
       (int)((ulong)((long)(this->coord_files).
                           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->coord_files).
                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
  initializeCoordinates
            (this,(vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_2b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##  Read ",9);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," files.",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  if (local_2a0 != local_290) {
    operator_delete(local_2a0);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

Collimator::Collimator(string coord_filename, set<int> angles) {
    ifstream coord_file(coord_filename.c_str(), ios::in);
    string line, aux;
    int angle;

    if (! coord_file)
      cerr << "ERROR: unable to open instance file: " << coord_filename << ", stopping! \n";

    cout << "##Reading collimator coordinates info." << endl;
    while (coord_file) {
      getline(coord_file, line);
      if (line.empty()) continue;
      aux   = line.substr(0, line.find(delimiter));
      angle = atoi(aux.c_str());
      if (angles.find(angle) == angles.end()) continue;
      line.erase(0, line.find(delimiter) + delimiter.length());
      cout << "##  " << line << " a:" << angle << endl;
      coord_files.push_back(make_pair(angle,line));
    }
    coord_file.close();
    n_angles=coord_files.size();
    initializeCoordinates(coord_files);
    cout << "##  Read " << coord_files.size()<< " files."<< endl;
  }